

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::SubmitExtraFiles(cmCTest *this,char *cfiles)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_1c9;
  VectorOfStrings files;
  vector<cmsys::String,_std::allocator<cmsys::String>_> local_1b0;
  ostringstream cmCTestLog_msg;
  
  if (cfiles == (char *)0x0) {
    bVar1 = true;
  }
  else {
    files.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    files.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    files.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Submit extra files");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x60a,(char *)local_1b0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                      _M_impl.super__Vector_impl_data._M_start,false);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::string((string *)&cmCTestLog_msg,cfiles,&local_1c9);
    cmsys::SystemTools::SplitString(&local_1b0,(string *)&cmCTestLog_msg,';',false);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::_M_move_assign(&files,&local_1b0);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_1b0);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (files.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
        super__Vector_impl_data._M_start ==
        files.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar1 = true;
    }
    else {
      bVar1 = SubmitExtraFiles(this,&files);
    }
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&files);
  }
  return bVar1;
}

Assistant:

bool cmCTest::SubmitExtraFiles(const char* cfiles)
{
  if (!cfiles) {
    return true;
  }

  VectorOfStrings files;

  cmCTestLog(this, OUTPUT, "Submit extra files" << std::endl);

  files = cmSystemTools::SplitString(cfiles, ';');
  if (files.empty()) {
    return true;
  }

  return this->SubmitExtraFiles(files);
}